

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::CPU(CPU *this)

{
  this->_vptr_CPU = (_func_int **)&PTR__CPU_0011cac8;
  this->hz = 0;
  this->total_cycles = 0;
  this->PC = 0xc000;
  this->A = '\0';
  this->X = '\0';
  this->Y = '\0';
  this->S = 0xfd;
  this->field_0x2e = this->field_0x2e & 0x10 | 4;
  this->m = (Memory *)0x0;
  this->cycles = 0;
  instrTable[0] = (Instruction)instrBRK0x00;
  instrTable[1] = 0;
  instrTable[2] = (Instruction)instrORA0x01;
  instrTable[3] = 0;
  instrTable[10] = (Instruction)instrORA0x05;
  instrTable[0xb] = 0;
  instrTable[0xc] = (Instruction)instrASL0x06;
  instrTable[0xd] = 0;
  instrTable[0x10] = (Instruction)instrPHP0x08;
  instrTable[0x11] = 0;
  instrTable[0x12] = (Instruction)instrORA0x09;
  instrTable[0x13] = 0;
  instrTable[0x14] = (Instruction)instrASL0x0a;
  instrTable[0x15] = 0;
  instrTable[0x1a] = (Instruction)instrORA0x0d;
  instrTable[0x1b] = 0;
  instrTable[0x1c] = (Instruction)instrASL0x0e;
  instrTable[0x1d] = 0;
  instrTable[0x20] = (Instruction)instrBPL0x10;
  instrTable[0x21] = 0;
  instrTable[0x22] = (Instruction)instrORA0x11;
  instrTable[0x23] = 0;
  instrTable[0x2a] = (Instruction)instrORA0x15;
  instrTable[0x2b] = 0;
  instrTable[0x2c] = (Instruction)instrASL0x16;
  instrTable[0x2d] = 0;
  instrTable[0x30] = (Instruction)instrCLC0x18;
  instrTable[0x31] = 0;
  instrTable[0x32] = (Instruction)instrORA0x19;
  instrTable[0x33] = 0;
  instrTable[0x3a] = (Instruction)instrORA0x1d;
  instrTable[0x3b] = 0;
  instrTable[0x3c] = (Instruction)instrASL0x1e;
  instrTable[0x3d] = 0;
  instrTable[0x40] = (Instruction)instrJSR0x20;
  instrTable[0x41] = 0;
  instrTable[0x42] = (Instruction)instrAND0x21;
  instrTable[0x43] = 0;
  instrTable[0x48] = (Instruction)instrBIT0x24;
  instrTable[0x49] = 0;
  instrTable[0x4a] = (Instruction)instrAND0x25;
  instrTable[0x4b] = 0;
  instrTable[0x4c] = (Instruction)instrROL0x26;
  instrTable[0x4d] = 0;
  instrTable[0x50] = (Instruction)instrPLP0x28;
  instrTable[0x51] = 0;
  instrTable[0x52] = (Instruction)instrAND0x29;
  instrTable[0x53] = 0;
  instrTable[0x54] = (Instruction)instrROL0x2a;
  instrTable[0x55] = 0;
  instrTable[0x58] = (Instruction)instrBIT0x2c;
  instrTable[0x59] = 0;
  instrTable[0x5a] = (Instruction)instrAND0x2d;
  instrTable[0x5b] = 0;
  instrTable[0x5c] = (Instruction)instrROL0x2e;
  instrTable[0x5d] = 0;
  instrTable[0x60] = (Instruction)instrBMI0x30;
  instrTable[0x61] = 0;
  instrTable[0x62] = (Instruction)instrAND0x31;
  instrTable[99] = 0;
  instrTable[0x6a] = (Instruction)instrAND0x35;
  instrTable[0x6b] = 0;
  instrTable[0x6c] = (Instruction)instrROL0x36;
  instrTable[0x6d] = 0;
  instrTable[0x70] = (Instruction)instrSEC0x38;
  instrTable[0x71] = 0;
  instrTable[0x72] = (Instruction)instrAND0x39;
  instrTable[0x73] = 0;
  instrTable[0x7a] = (Instruction)instrAND0x3d;
  instrTable[0x7b] = 0;
  instrTable[0x7c] = (Instruction)instrROL0x3e;
  instrTable[0x7d] = 0;
  instrTable[0x80] = (Instruction)instrRTI0x40;
  instrTable[0x81] = 0;
  instrTable[0x82] = (Instruction)instrEOR0x41;
  instrTable[0x83] = 0;
  instrTable[0x8a] = (Instruction)instrEOR0x45;
  instrTable[0x8b] = 0;
  instrTable[0x8c] = (Instruction)instrLSR0x46;
  instrTable[0x8d] = 0;
  instrTable[0x90] = (Instruction)instrPHA0x48;
  instrTable[0x91] = 0;
  instrTable[0x92] = (Instruction)instrEOR0x49;
  instrTable[0x93] = 0;
  instrTable[0x94] = (Instruction)instrLSR0x4a;
  instrTable[0x95] = 0;
  instrTable[0x98] = (Instruction)instrJMP0x4c;
  instrTable[0x99] = 0;
  instrTable[0x9a] = (Instruction)instrEOR0x4d;
  instrTable[0x9b] = 0;
  instrTable[0x9c] = (Instruction)instrLSR0x4e;
  instrTable[0x9d] = 0;
  instrTable[0xa0] = (Instruction)instrBVC0x50;
  instrTable[0xa1] = 0;
  instrTable[0xa2] = (Instruction)instrEOR0x51;
  instrTable[0xa3] = 0;
  instrTable[0xaa] = (Instruction)instrEOR0x55;
  instrTable[0xab] = 0;
  instrTable[0xac] = (Instruction)instrLSR0x56;
  instrTable[0xad] = 0;
  instrTable[0xb0] = (Instruction)instrCLI0x58;
  instrTable[0xb1] = 0;
  instrTable[0xb2] = (Instruction)instrEOR0x59;
  instrTable[0xb3] = 0;
  instrTable[0xba] = (Instruction)instrEOR0x5d;
  instrTable[0xbb] = 0;
  instrTable[0xbc] = (Instruction)instrLSR0x5e;
  instrTable[0xbd] = 0;
  instrTable[0xc0] = (Instruction)instrRTS0x60;
  instrTable[0xc1] = 0;
  instrTable[0xc2] = (Instruction)instrADC0x61;
  instrTable[0xc3] = 0;
  instrTable[0xca] = (Instruction)instrADC0x65;
  instrTable[0xcb] = 0;
  instrTable[0xcc] = (Instruction)instrROR0x66;
  instrTable[0xcd] = 0;
  instrTable[0xd0] = (Instruction)instrPLA0x68;
  instrTable[0xd1] = 0;
  instrTable[0xd2] = (Instruction)instrADC0x69;
  instrTable[0xd3] = 0;
  instrTable[0xd4] = (Instruction)instrROR0x6a;
  instrTable[0xd5] = 0;
  instrTable[0xd8] = (Instruction)instrJMP0x6c;
  instrTable[0xd9] = 0;
  instrTable[0xda] = (Instruction)instrADC0x6d;
  instrTable[0xdb] = 0;
  instrTable[0xdc] = (Instruction)instrROR0x6e;
  instrTable[0xdd] = 0;
  instrTable[0xe0] = (Instruction)instrBVS0x70;
  instrTable[0xe1] = 0;
  instrTable[0xe2] = (Instruction)instrADC0x71;
  instrTable[0xe3] = 0;
  instrTable[0xea] = (Instruction)instrADC0x75;
  instrTable[0xeb] = 0;
  instrTable[0xec] = (Instruction)instrROR0x76;
  instrTable[0xed] = 0;
  instrTable[0xf0] = (Instruction)instrSEI0x78;
  instrTable[0xf1] = 0;
  instrTable[0xf2] = (Instruction)instrADC0x79;
  instrTable[0xf3] = 0;
  instrTable[0xfa] = (Instruction)instrADC0x7d;
  instrTable[0xfb] = 0;
  instrTable[0xfc] = (Instruction)instrROR0x7e;
  instrTable[0xfd] = 0;
  _DAT_0011db30 = instrSTA0x81;
  _DAT_0011db38 = 0;
  _DAT_0011db60 = instrSTY0x84;
  _DAT_0011db68 = 0;
  _DAT_0011db70 = instrSTA0x85;
  _DAT_0011db78 = 0;
  _DAT_0011db80 = instrSTX0x86;
  _DAT_0011db88 = 0;
  _DAT_0011dba0 = instrDEY0x88;
  _DAT_0011dba8 = 0;
  _DAT_0011dbc0 = instrTXA0x8a;
  _DAT_0011dbc8 = 0;
  _DAT_0011dbe0 = instrSTY0x8c;
  _DAT_0011dbe8 = 0;
  _DAT_0011dbf0 = instrSTA0x8d;
  _DAT_0011dbf8 = 0;
  _DAT_0011dc00 = instrSTX0x8e;
  _DAT_0011dc08 = 0;
  _DAT_0011dc20 = instrBCC0x90;
  _DAT_0011dc28 = 0;
  _DAT_0011dc30 = instrSTA0x91;
  _DAT_0011dc38 = 0;
  _DAT_0011dc60 = instrSTY0x94;
  _DAT_0011dc68 = 0;
  _DAT_0011dc70 = instrSTA0x95;
  _DAT_0011dc78 = 0;
  _DAT_0011dc80 = instrSTX0x96;
  _DAT_0011dc88 = 0;
  _DAT_0011dca0 = instrTYA0x98;
  _DAT_0011dca8 = 0;
  _DAT_0011dcb0 = instrSTA0x99;
  _DAT_0011dcb8 = 0;
  _DAT_0011dcc0 = instrTXS0x9a;
  _DAT_0011dcc8 = 0;
  _DAT_0011dcf0 = instrSTA0x9d;
  _DAT_0011dcf8 = 0;
  _DAT_0011dd20 = instrLDY0xa0;
  _DAT_0011dd28 = 0;
  _DAT_0011dd30 = instrLDA0xa1;
  _DAT_0011dd38 = 0;
  _DAT_0011dd40 = instrLDX0xa2;
  _DAT_0011dd48 = 0;
  _DAT_0011dd60 = instrLDY0xa4;
  _DAT_0011dd68 = 0;
  _DAT_0011dd70 = instrLDA0xa5;
  _DAT_0011dd78 = 0;
  _DAT_0011dd80 = instrLDX0xa6;
  _DAT_0011dd88 = 0;
  _DAT_0011dda0 = instrTAY0xa8;
  _DAT_0011dda8 = 0;
  _DAT_0011ddb0 = instrLDA0xa9;
  _DAT_0011ddb8 = 0;
  _DAT_0011ddc0 = instrTAX0xaa;
  _DAT_0011ddc8 = 0;
  _DAT_0011dde0 = instrLDY0xac;
  _DAT_0011dde8 = 0;
  _DAT_0011ddf0 = instrLDA0xad;
  _DAT_0011ddf8 = 0;
  _DAT_0011de00 = instrLDX0xae;
  _DAT_0011de08 = 0;
  _DAT_0011de20 = instrBCS0xb0;
  _DAT_0011de28 = 0;
  _DAT_0011de30 = instrLDA0xb1;
  _DAT_0011de38 = 0;
  _DAT_0011de60 = instrLDY0xb4;
  _DAT_0011de68 = 0;
  _DAT_0011de70 = instrLDA0xb5;
  _DAT_0011de78 = 0;
  _DAT_0011de80 = instrLDX0xb6;
  _DAT_0011de88 = 0;
  _DAT_0011dea0 = instrCLV0xb8;
  _DAT_0011dea8 = 0;
  _DAT_0011deb0 = instrLDA0xb9;
  _DAT_0011deb8 = 0;
  _DAT_0011dec0 = instrTSX0xba;
  _DAT_0011dec8 = 0;
  _DAT_0011dee0 = instrLDY0xbc;
  _DAT_0011dee8 = 0;
  _DAT_0011def0 = instrLDA0xbd;
  _DAT_0011def8 = 0;
  _DAT_0011df00 = instrLDX0xbe;
  _DAT_0011df08 = 0;
  _DAT_0011df20 = instrCPY0xc0;
  _DAT_0011df28 = 0;
  _DAT_0011df30 = instrCMP0xc1;
  _DAT_0011df38 = 0;
  _DAT_0011df60 = instrCPY0xc4;
  _DAT_0011df68 = 0;
  _DAT_0011df70 = instrCMP0xc5;
  _DAT_0011df78 = 0;
  _DAT_0011df80 = instrDEC0xc6;
  _DAT_0011df88 = 0;
  _DAT_0011dfa0 = instrINY0xc8;
  _DAT_0011dfa8 = 0;
  _DAT_0011dfb0 = instrCMP0xc9;
  _DAT_0011dfb8 = 0;
  _DAT_0011dfc0 = instrDEX0xca;
  _DAT_0011dfc8 = 0;
  _DAT_0011dfe0 = instrCPY0xcc;
  _DAT_0011dfe8 = 0;
  _DAT_0011dff0 = instrCMP0xcd;
  _DAT_0011dff8 = 0;
  _DAT_0011e000 = instrDEC0xce;
  _DAT_0011e008 = 0;
  _DAT_0011e020 = instrBNE0xd0;
  _DAT_0011e028 = 0;
  _DAT_0011e030 = instrCMP0xd1;
  _DAT_0011e038 = 0;
  _DAT_0011e070 = instrCMP0xd5;
  _DAT_0011e078 = 0;
  _DAT_0011e080 = instrDEC0xd6;
  _DAT_0011e088 = 0;
  _DAT_0011e0a0 = instrCLD0xd8;
  _DAT_0011e0a8 = 0;
  _DAT_0011e0b0 = instrCMP0xd9;
  _DAT_0011e0b8 = 0;
  _DAT_0011e0f0 = instrCMP0xdd;
  _DAT_0011e0f8 = 0;
  _DAT_0011e100 = instrDEC0xde;
  _DAT_0011e108 = 0;
  _DAT_0011e120 = instrCPX0xe0;
  _DAT_0011e128 = 0;
  _DAT_0011e130 = instrSBC0xe1;
  _DAT_0011e138 = 0;
  _DAT_0011e160 = instrCPX0xe4;
  _DAT_0011e168 = 0;
  _DAT_0011e170 = instrSBC0xe5;
  _DAT_0011e178 = 0;
  _DAT_0011e180 = instrINC0xe6;
  _DAT_0011e188 = 0;
  _DAT_0011e1a0 = instrINX0xe8;
  _DAT_0011e1a8 = 0;
  _DAT_0011e1b0 = instrSBC0xe9;
  _DAT_0011e1b8 = 0;
  _DAT_0011e1c0 = instrNOP0xea;
  _DAT_0011e1c8 = 0;
  _DAT_0011e1e0 = instrCPX0xec;
  _DAT_0011e1e8 = 0;
  _DAT_0011e1f0 = instrSBC0xed;
  _DAT_0011e1f8 = 0;
  _DAT_0011e200 = instrINC0xee;
  _DAT_0011e208 = 0;
  _DAT_0011e220 = instrBEQ0xf0;
  _DAT_0011e228 = 0;
  _DAT_0011e230 = instrSBC0xf1;
  _DAT_0011e238 = 0;
  _DAT_0011e270 = instrSBC0xf5;
  _DAT_0011e278 = 0;
  _DAT_0011e280 = instrINC0xf6;
  _DAT_0011e288 = 0;
  _DAT_0011e2a0 = instrSED0xf8;
  _DAT_0011e2a8 = 0;
  _DAT_0011e2b0 = instrSBC0xf9;
  _DAT_0011e2b8 = 0;
  _DAT_0011e2f0 = instrSBC0xfd;
  _DAT_0011e2f8 = 0;
  _DAT_0011e300 = instrINC0xfe;
  _DAT_0011e308 = 0;
  return;
}

Assistant:

CPU::CPU() {
	PC = 0xC000;
	A = 0;
	X = 0;
	Y = 0;
	S = 0xFD;
	I = 0;
	B = 0;
	U = 1;
	Z = 0;
	N = 0;
	V = 0;
	C = 0;
	m = NULL;
	cycles = 0;

	instrTable[0x00] = &CPU::instrBRK0x00;
	instrTable[0x01] = &CPU::instrORA0x01;
	instrTable[0x05] = &CPU::instrORA0x05;
	instrTable[0x06] = &CPU::instrASL0x06;
	instrTable[0x08] = &CPU::instrPHP0x08;
	instrTable[0x09] = &CPU::instrORA0x09;
	instrTable[0x0a] = &CPU::instrASL0x0a;
	instrTable[0x0d] = &CPU::instrORA0x0d;
	instrTable[0x0e] = &CPU::instrASL0x0e;
	instrTable[0x10] = &CPU::instrBPL0x10;
	instrTable[0x11] = &CPU::instrORA0x11;
	instrTable[0x15] = &CPU::instrORA0x15;
	instrTable[0x16] = &CPU::instrASL0x16;
	instrTable[0x18] = &CPU::instrCLC0x18;
	instrTable[0x19] = &CPU::instrORA0x19;
	instrTable[0x1d] = &CPU::instrORA0x1d;
	instrTable[0x1e] = &CPU::instrASL0x1e;
	instrTable[0x20] = &CPU::instrJSR0x20;
	instrTable[0x21] = &CPU::instrAND0x21;
	instrTable[0x24] = &CPU::instrBIT0x24;
	instrTable[0x25] = &CPU::instrAND0x25;
	instrTable[0x26] = &CPU::instrROL0x26;
	instrTable[0x28] = &CPU::instrPLP0x28;
	instrTable[0x29] = &CPU::instrAND0x29;
	instrTable[0x2a] = &CPU::instrROL0x2a;
	instrTable[0x2c] = &CPU::instrBIT0x2c;
	instrTable[0x2d] = &CPU::instrAND0x2d;
	instrTable[0x2e] = &CPU::instrROL0x2e;
	instrTable[0x30] = &CPU::instrBMI0x30;
	instrTable[0x31] = &CPU::instrAND0x31;
	instrTable[0x35] = &CPU::instrAND0x35;
	instrTable[0x36] = &CPU::instrROL0x36;
	instrTable[0x38] = &CPU::instrSEC0x38;
	instrTable[0x39] = &CPU::instrAND0x39;
	instrTable[0x3d] = &CPU::instrAND0x3d;
	instrTable[0x3e] = &CPU::instrROL0x3e;
	instrTable[0x40] = &CPU::instrRTI0x40;
	instrTable[0x41] = &CPU::instrEOR0x41;
	instrTable[0x45] = &CPU::instrEOR0x45;
	instrTable[0x46] = &CPU::instrLSR0x46;
	instrTable[0x48] = &CPU::instrPHA0x48;
	instrTable[0x49] = &CPU::instrEOR0x49;
	instrTable[0x4a] = &CPU::instrLSR0x4a;
	instrTable[0x4c] = &CPU::instrJMP0x4c;
	instrTable[0x4d] = &CPU::instrEOR0x4d;
	instrTable[0x4e] = &CPU::instrLSR0x4e;
	instrTable[0x50] = &CPU::instrBVC0x50;
	instrTable[0x51] = &CPU::instrEOR0x51;
	instrTable[0x55] = &CPU::instrEOR0x55;
	instrTable[0x56] = &CPU::instrLSR0x56;
	instrTable[0x58] = &CPU::instrCLI0x58;
	instrTable[0x59] = &CPU::instrEOR0x59;
	instrTable[0x5d] = &CPU::instrEOR0x5d;
	instrTable[0x5e] = &CPU::instrLSR0x5e;
	instrTable[0x60] = &CPU::instrRTS0x60;
	instrTable[0x61] = &CPU::instrADC0x61;
	instrTable[0x65] = &CPU::instrADC0x65;
	instrTable[0x66] = &CPU::instrROR0x66;
	instrTable[0x68] = &CPU::instrPLA0x68;
	instrTable[0x69] = &CPU::instrADC0x69;
	instrTable[0x6a] = &CPU::instrROR0x6a;
	instrTable[0x6c] = &CPU::instrJMP0x6c;
	instrTable[0x6d] = &CPU::instrADC0x6d;
	instrTable[0x6e] = &CPU::instrROR0x6e;
	instrTable[0x70] = &CPU::instrBVS0x70;
	instrTable[0x71] = &CPU::instrADC0x71;
	instrTable[0x75] = &CPU::instrADC0x75;
	instrTable[0x76] = &CPU::instrROR0x76;
	instrTable[0x78] = &CPU::instrSEI0x78;
	instrTable[0x79] = &CPU::instrADC0x79;
	instrTable[0x7d] = &CPU::instrADC0x7d;
	instrTable[0x7e] = &CPU::instrROR0x7e;
	instrTable[0x81] = &CPU::instrSTA0x81;
	instrTable[0x84] = &CPU::instrSTY0x84;
	instrTable[0x85] = &CPU::instrSTA0x85;
	instrTable[0x86] = &CPU::instrSTX0x86;
	instrTable[0x88] = &CPU::instrDEY0x88;
	instrTable[0x8a] = &CPU::instrTXA0x8a;
	instrTable[0x8c] = &CPU::instrSTY0x8c;
	instrTable[0x8d] = &CPU::instrSTA0x8d;
	instrTable[0x8e] = &CPU::instrSTX0x8e;
	instrTable[0x90] = &CPU::instrBCC0x90;
	instrTable[0x91] = &CPU::instrSTA0x91;
	instrTable[0x94] = &CPU::instrSTY0x94;
	instrTable[0x95] = &CPU::instrSTA0x95;
	instrTable[0x96] = &CPU::instrSTX0x96;
	instrTable[0x98] = &CPU::instrTYA0x98;
	instrTable[0x99] = &CPU::instrSTA0x99;
	instrTable[0x9a] = &CPU::instrTXS0x9a;
	instrTable[0x9d] = &CPU::instrSTA0x9d;
	instrTable[0xa0] = &CPU::instrLDY0xa0;
	instrTable[0xa1] = &CPU::instrLDA0xa1;
	instrTable[0xa2] = &CPU::instrLDX0xa2;
	instrTable[0xa4] = &CPU::instrLDY0xa4;
	instrTable[0xa5] = &CPU::instrLDA0xa5;
	instrTable[0xa6] = &CPU::instrLDX0xa6;
	instrTable[0xa8] = &CPU::instrTAY0xa8;
	instrTable[0xa9] = &CPU::instrLDA0xa9;
	instrTable[0xaa] = &CPU::instrTAX0xaa;
	instrTable[0xac] = &CPU::instrLDY0xac;
	instrTable[0xad] = &CPU::instrLDA0xad;
	instrTable[0xae] = &CPU::instrLDX0xae;
	instrTable[0xb0] = &CPU::instrBCS0xb0;
	instrTable[0xb1] = &CPU::instrLDA0xb1;
	instrTable[0xb4] = &CPU::instrLDY0xb4;
	instrTable[0xb5] = &CPU::instrLDA0xb5;
	instrTable[0xb6] = &CPU::instrLDX0xb6;
	instrTable[0xb8] = &CPU::instrCLV0xb8;
	instrTable[0xb9] = &CPU::instrLDA0xb9;
	instrTable[0xba] = &CPU::instrTSX0xba;
	instrTable[0xbc] = &CPU::instrLDY0xbc;
	instrTable[0xbd] = &CPU::instrLDA0xbd;
	instrTable[0xbe] = &CPU::instrLDX0xbe;
	instrTable[0xc0] = &CPU::instrCPY0xc0;
	instrTable[0xc1] = &CPU::instrCMP0xc1;
	instrTable[0xc4] = &CPU::instrCPY0xc4;
	instrTable[0xc5] = &CPU::instrCMP0xc5;
	instrTable[0xc6] = &CPU::instrDEC0xc6;
	instrTable[0xc8] = &CPU::instrINY0xc8;
	instrTable[0xc9] = &CPU::instrCMP0xc9;
	instrTable[0xca] = &CPU::instrDEX0xca;
	instrTable[0xcc] = &CPU::instrCPY0xcc;
	instrTable[0xcd] = &CPU::instrCMP0xcd;
	instrTable[0xce] = &CPU::instrDEC0xce;
	instrTable[0xd0] = &CPU::instrBNE0xd0;
	instrTable[0xd1] = &CPU::instrCMP0xd1;
	instrTable[0xd5] = &CPU::instrCMP0xd5;
	instrTable[0xd6] = &CPU::instrDEC0xd6;
	instrTable[0xd8] = &CPU::instrCLD0xd8;
	instrTable[0xd9] = &CPU::instrCMP0xd9;
	instrTable[0xdd] = &CPU::instrCMP0xdd;
	instrTable[0xde] = &CPU::instrDEC0xde;
	instrTable[0xe0] = &CPU::instrCPX0xe0;
	instrTable[0xe1] = &CPU::instrSBC0xe1;
	instrTable[0xe4] = &CPU::instrCPX0xe4;
	instrTable[0xe5] = &CPU::instrSBC0xe5;
	instrTable[0xe6] = &CPU::instrINC0xe6;
	instrTable[0xe8] = &CPU::instrINX0xe8;
	instrTable[0xe9] = &CPU::instrSBC0xe9;
	instrTable[0xea] = &CPU::instrNOP0xea;
	instrTable[0xec] = &CPU::instrCPX0xec;
	instrTable[0xed] = &CPU::instrSBC0xed;
	instrTable[0xee] = &CPU::instrINC0xee;
	instrTable[0xf0] = &CPU::instrBEQ0xf0;
	instrTable[0xf1] = &CPU::instrSBC0xf1;
	instrTable[0xf5] = &CPU::instrSBC0xf5;
	instrTable[0xf6] = &CPU::instrINC0xf6;
	instrTable[0xf8] = &CPU::instrSED0xf8;
	instrTable[0xf9] = &CPU::instrSBC0xf9;
	instrTable[0xfd] = &CPU::instrSBC0xfd;
	instrTable[0xfe] = &CPU::instrINC0xfe;

}